

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSDist_COF.cpp
# Opt level: O1

void __thiscall FSDist_COF::FSDist_COF(FSDist_COF *this)

{
  (this->super_FactoredStateDistribution).super_StateDistribution._vptr_StateDistribution =
       (_func_int **)&PTR__FSDist_COF_005e77e8;
  this->_m_nrStateFactors = 0;
  (this->_m_sfacDomainSizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_sfacDomainSizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_sfacDomainSizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_stepSize = (size_t *)0x0;
  (this->_m_probs).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_probs).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_probs).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

FSDist_COF::FSDist_COF() :
    _m_nrStateFactors(0),
    _m_sfacDomainSizes(0),
    _m_stepSize(0),
    _m_probs(0)
{
}